

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

void ImageRotateCW(Image *image)

{
  int iVar1;
  void *pvVar2;
  uint uVar3;
  void *pvVar4;
  long lVar5;
  void *pvVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  void *pvVar11;
  long lVar12;
  long lVar13;
  
  if (((image->data != (void *)0x0) && (image->width != 0)) && (image->height != 0)) {
    if (1 < image->mipmaps) {
      TraceLog(4,"Image manipulation only applied to base mipmap level");
    }
    if (0xd < image->format) {
      TraceLog(4,"Image manipulation not supported for compressed formats");
      return;
    }
    uVar3 = GetPixelDataSize(1,1,image->format);
    iVar1 = image->width;
    lVar12 = (long)image->height;
    pvVar4 = malloc((long)(int)(image->height * iVar1 * uVar3));
    if (0 < lVar12) {
      lVar5 = (long)(int)uVar3;
      pvVar6 = (void *)((long)pvVar4 + (lVar12 + -1) * lVar5);
      lVar8 = 0;
      lVar9 = 0;
      do {
        if (0 < iVar1) {
          lVar13 = 0;
          lVar10 = lVar8;
          pvVar11 = pvVar6;
          do {
            if (0 < (int)uVar3) {
              pvVar2 = image->data;
              uVar7 = 0;
              do {
                *(undefined1 *)((long)pvVar11 + uVar7) =
                     *(undefined1 *)((long)pvVar2 + uVar7 + lVar10);
                uVar7 = uVar7 + 1;
              } while (uVar3 != uVar7);
            }
            lVar13 = lVar13 + 1;
            pvVar11 = (void *)((long)pvVar11 + lVar5 * lVar12);
            lVar10 = lVar10 + lVar5;
          } while (lVar13 != iVar1);
        }
        lVar9 = lVar9 + 1;
        pvVar6 = (void *)((long)pvVar6 - lVar5);
        lVar8 = lVar8 + lVar5 * iVar1;
      } while (lVar9 != lVar12);
    }
    free(image->data);
    image->data = pvVar4;
    lVar12._0_4_ = image->width;
    lVar12._4_4_ = image->height;
    uVar7._0_4_ = image->width;
    uVar7._4_4_ = image->height;
    uVar7 = lVar12 << 0x20 | uVar7 >> 0x20;
    image->width = (int)uVar7;
    image->height = (int)(uVar7 >> 0x20);
  }
  return;
}

Assistant:

void ImageRotateCW(Image *image)
{
    // Security check to avoid program crash
    if ((image->data == NULL) || (image->width == 0) || (image->height == 0)) return;

    if (image->mipmaps > 1) TRACELOG(LOG_WARNING, "Image manipulation only applied to base mipmap level");
    if (image->format >= PIXELFORMAT_COMPRESSED_DXT1_RGB) TRACELOG(LOG_WARNING, "Image manipulation not supported for compressed formats");
    else
    {
        int bytesPerPixel = GetPixelDataSize(1, 1, image->format);
        unsigned char *rotatedData = (unsigned char *)RL_MALLOC(image->width*image->height*bytesPerPixel);

        for (int y = 0; y < image->height; y++)
        {
            for (int x = 0; x < image->width; x++)
            {
                //memcpy(rotatedData + (x*image->height + (image->height - y - 1))*bytesPerPixel, ((unsigned char *)image->data) + (y*image->width + x)*bytesPerPixel, bytesPerPixel);
                for (int i = 0; i < bytesPerPixel; i++) rotatedData[(x*image->height + (image->height - y - 1))*bytesPerPixel + i] = ((unsigned char *)image->data)[(y*image->width + x)*bytesPerPixel + i];
            }
        }

        RL_FREE(image->data);
        image->data = rotatedData;
        int width = image->width;
        int height = image-> height;

        image->width = height;
        image->height = width;
    }
}